

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test(void)

{
  istream *piVar1;
  ostream *poVar2;
  int local_24;
  char local_1d;
  int i;
  char c;
  int e;
  int n;
  int dist;
  int b;
  int a;
  
  freopen("C:/Project/CLion/ShortestPathAlgorithmWithHeaps/data1.txt","r",_stdin);
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)&stack0xffffffffffffffe8)
  ;
  std::istream::operator>>(piVar1,&i);
  for (local_24 = 0; local_24 < 100; local_24 = local_24 + 1) {
    piVar1 = std::operator>>((istream *)&std::cin,&local_1d);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&dist);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&n);
    std::istream::operator>>(piVar1,&e);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,dist);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,n);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,e);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void test() {
    int a, b, dist;
    int n, e;
    char c;
    freopen("C:/Project/CLion/ShortestPathAlgorithmWithHeaps/data1.txt", "r", stdin);
    cin >> n >> e;
    for (int i = 0; i < 100; i++) {
        cin >> c >> a >> b >> dist;
        cout << a << " " << b << " " << dist << endl;
    }

}